

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O3

ostream * glu::decl::operator<<(ostream *str,DeclareVariable *decl)

{
  Type TVar1;
  int iVar2;
  Precision precision;
  StructType *pSVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  DeclareVariable *pDVar8;
  int *piVar9;
  vector<int,_std::allocator<int>_> arraySizes;
  vector<int,_std::allocator<int>_> local_58;
  DeclareStructTypePtr local_40;
  
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  for (pDVar8 = decl; TVar1 = (pDVar8->varType).m_type, TVar1 == TYPE_ARRAY;
      pDVar8 = (DeclareVariable *)(pDVar8->varType).m_data.array.elementType) {
    iVar2 = (pDVar8->varType).m_data.array.size;
    local_40.structPtr = (StructType *)CONCAT44(local_40.structPtr._4_4_,iVar2);
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_58,
                 (iterator)
                 local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_40);
    }
    else {
      *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = iVar2;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar2 = (int)str;
  if (TVar1 == TYPE_BASIC) {
    precision = (pDVar8->varType).m_data.basic.precision;
    if (precision != PRECISION_LAST) {
      pcVar7 = getPrecisionName(precision);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)str + -0x18));
      }
      else {
        sVar4 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(str,pcVar7,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(str," ",1);
    }
    pcVar7 = getDataTypeName((pDVar8->varType).m_data.basic.type);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)str + -0x18));
    }
    else {
      sVar4 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(str,pcVar7,sVar4);
    }
  }
  else if (TVar1 == TYPE_STRUCT) {
    pSVar3 = (pDVar8->varType).m_data.structPtr;
    if ((pSVar3->m_typeName)._M_string_length == 0) {
      local_40.indentLevel = decl->indentLevel;
      local_40.structPtr = pSVar3;
      operator<<(str,&local_40);
    }
    else {
      pcVar7 = (pSVar3->m_typeName)._M_dataplus._M_p;
      if (pcVar7 == (char *)0x0) {
        std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)str + -0x18));
      }
      else {
        sVar4 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(str,pcVar7,sVar4);
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(str," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (str,(decl->name)._M_dataplus._M_p,(decl->name)._M_string_length);
  piVar9 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      iVar2 = *piVar9;
      if (iVar2 == -1) {
        lVar6 = 2;
        pcVar7 = "[]";
        poVar5 = str;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(str,"[",1);
        poVar5 = (ostream *)std::ostream::operator<<(str,iVar2);
        lVar6 = 1;
        pcVar7 = "]";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,lVar6);
      piVar9 = piVar9 + 1;
    } while (piVar9 != local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const DeclareVariable& decl)
{
	const VarType&		type	= decl.varType;
	const VarType*		curType	= &type;
	std::vector<int>	arraySizes;

	// Handle arrays.
	while (curType->isArrayType())
	{
		arraySizes.push_back(curType->getArraySize());
		curType = &curType->getElementType();
	}

	if (curType->isBasicType())
	{
		if (curType->getPrecision() != PRECISION_LAST)
			str << glu::getPrecisionName(curType->getPrecision()) << " ";
		str << glu::getDataTypeName(curType->getBasicType());
	}
	else if (curType->isStructType())
	{
		const StructType* structPtr = curType->getStructPtr();

		if (structPtr->hasTypeName())
			str << structPtr->getTypeName();
		else
			str << declare(structPtr, decl.indentLevel); // Generate inline declaration.
	}
	else
		DE_ASSERT(false);

	str << " " << decl.name;

	// Print array sizes.
	for (std::vector<int>::const_iterator sizeIter = arraySizes.begin(); sizeIter != arraySizes.end(); sizeIter++)
	{
		const int arrSize = *sizeIter;
		if (arrSize == VarType::UNSIZED_ARRAY)
			str << "[]";
		else
			str << "[" << arrSize << "]";
	}

	return str;
}